

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_read_cmap_v2(opj_jp2_v2_t *jp2,uchar *p_cmap_header_data,OPJ_UINT32 p_cmap_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *p_value;
  byte bVar1;
  undefined8 in_RAX;
  opj_jp2_cmap_comp_t *poVar2;
  char *fmt;
  long lVar3;
  opj_jp2_pclr_t *poVar4;
  OPJ_UINT32 l_value;
  undefined8 uStack_38;
  
  poVar4 = (jp2->color).jp2_pclr;
  if (poVar4 == (opj_jp2_pclr_t *)0x0) {
    fmt = "Need to read a PCLR box before the CMAP box.\n";
  }
  else {
    if (poVar4->cmap == (opj_jp2_cmap_comp_t *)0x0) {
      bVar1 = (byte)poVar4->nr_channels;
      uStack_38 = in_RAX;
      poVar2 = (opj_jp2_cmap_comp_t *)malloc((ulong)((uint)bVar1 * 4));
      if (bVar1 != 0) {
        lVar3 = 0;
        p_value = (OPJ_UINT32 *)((long)&uStack_38 + 4);
        do {
          opj_read_bytes_LE(p_cmap_header_data + lVar3,p_value,2);
          *(undefined2 *)((long)&poVar2->cmp + lVar3) = uStack_38._4_2_;
          opj_read_bytes_LE(p_cmap_header_data + lVar3 + 2,p_value,1);
          (&poVar2->mtyp)[lVar3] = uStack_38._4_1_;
          opj_read_bytes_LE(p_cmap_header_data + lVar3 + 3,p_value,1);
          (&poVar2->pcol)[lVar3] = uStack_38._4_1_;
          lVar3 = lVar3 + 4;
        } while ((ulong)bVar1 * 4 != lVar3);
        poVar4 = (jp2->color).jp2_pclr;
      }
      poVar4->cmap = poVar2;
      return 1;
    }
    fmt = "Only one CMAP box is allowed.\n";
  }
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

static opj_bool jp2_read_cmap_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_cmap_header_data,
							OPJ_UINT32 p_cmap_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	opj_jp2_cmap_comp_t *cmap;
	OPJ_BYTE i, nr_channels;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_cmap_header_data != 00);
	assert(p_manager != 00);

	/* Need nr_channels: */
	if(jp2->color.jp2_pclr == NULL) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Need to read a PCLR box before the CMAP box.\n");
		return OPJ_FALSE;
	}

	/* Part 1, I.5.3.5: 'There shall be at most one Component Mapping box
	 * inside a JP2 Header box' :
	*/
	if(jp2->color.jp2_pclr->cmap) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Only one CMAP box is allowed.\n");
		return OPJ_FALSE;
	}

	nr_channels = jp2->color.jp2_pclr->nr_channels;
	cmap = (opj_jp2_cmap_comp_t*) opj_malloc(nr_channels * sizeof(opj_jp2_cmap_comp_t));

	for(i = 0; i < nr_channels; ++i) {
		opj_read_bytes(p_cmap_header_data, &l_value, 2);			/* CMP^i */
		p_cmap_header_data +=2;
		cmap[i].cmp = (OPJ_UINT16) l_value;

		opj_read_bytes(p_cmap_header_data, &l_value, 1);			/* MTYP^i */
		++p_cmap_header_data;
		cmap[i].mtyp = (OPJ_BYTE) l_value;

		opj_read_bytes(p_cmap_header_data, &l_value, 1);			/* PCOL^i */
		++p_cmap_header_data;
		cmap[i].pcol = (OPJ_BYTE) l_value;
	}

	jp2->color.jp2_pclr->cmap = cmap;

	return OPJ_TRUE;
}